

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.h
# Opt level: O0

Orphan<capnp::AnyPointer> * __thiscall
capnp::copyOutOfMembrane<capnp::AnyPointer::Reader>
          (Orphan<capnp::AnyPointer> *__return_storage_ptr__,capnp *this,Reader *from,Orphanage to,
          Own<capnp::MembranePolicy> *policy)

{
  PointerReader from_00;
  Orphanage to_00;
  Own<capnp::MembranePolicy> *other;
  Own<capnp::MembranePolicy> local_98;
  BuilderArena *local_88;
  BuilderArena *pBStack_80;
  PointerReader local_70;
  OrphanBuilder local_50;
  Own<capnp::MembranePolicy> *local_30;
  Own<capnp::MembranePolicy> *policy_local;
  Reader *from_local;
  Orphanage to_local;
  
  to_local.arena = to.arena;
  local_30 = (Own<capnp::MembranePolicy> *)to.capTable;
  policy_local = (Own<capnp::MembranePolicy> *)this;
  from_local = from;
  to_local.capTable = (CapTableBuilder *)__return_storage_ptr__;
  _::PointerHelpers<capnp::AnyPointer,_(capnp::Kind)7>::getInternalReader(&local_70,(Reader *)this);
  local_88 = (BuilderArena *)from_local;
  pBStack_80 = to_local.arena;
  other = kj::mv<kj::Own<capnp::MembranePolicy>>((Own<capnp::MembranePolicy> *)to.capTable);
  kj::Own<capnp::MembranePolicy>::Own(&local_98,other);
  to_00.capTable = (CapTableBuilder *)pBStack_80;
  to_00.arena = local_88;
  from_00.capTable = local_70.capTable;
  from_00.segment = local_70.segment;
  from_00.pointer = local_70.pointer;
  from_00.nestingLimit = local_70.nestingLimit;
  from_00._28_4_ = local_70._28_4_;
  _::copyOutOfMembrane(&local_50,from_00,to_00,&local_98,false);
  Orphan<capnp::AnyPointer>::Orphan(__return_storage_ptr__,&local_50);
  _::OrphanBuilder::~OrphanBuilder(&local_50);
  kj::Own<capnp::MembranePolicy>::~Own(&local_98);
  return __return_storage_ptr__;
}

Assistant:

Orphan<typename kj::Decay<Reader>::Reads> copyOutOfMembrane(
    Reader&& from, Orphanage to, kj::Own<MembranePolicy> policy) {
  return _::copyOutOfMembrane(
      _::PointerHelpers<typename kj::Decay<Reader>::Reads>::getInternalReader(from),
      to, kj::mv(policy), false);
}